

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O3

void __thiscall Unowned_Function_Test::~Unowned_Function_Test(Unowned_Function_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Unowned, Function)
{
    unowned_ptr<decltype(save)> pNull {};
    EXPECT_ANY_THROW(pNull(1));

    unowned_ptr<decltype(save)> pSave {&save};
    saved = 0;
    pSave(1);
    EXPECT_EQ(saved, 1);
    pSave(2);
    EXPECT_EQ(saved, 2);
    pSave = {};
    EXPECT_ANY_THROW(pSave(2));
}